

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

ssize_t strhex_to_bin(uint8_t *buffer,size_t buffer_len,char *src)

{
  size_t sVar1;
  char *pcVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  
  sVar1 = strlen(src);
  if (buffer_len < sVar1 >> 1 || (sVar1 & 1) != 0) {
LAB_0014774c:
    lVar6 = -1;
  }
  else {
    lVar6 = 0;
    if (sVar1 != 0) {
      uVar5 = 0;
      do {
        pcVar2 = strchr(_hexchar_to_value_HEX,(int)src[uVar5]);
        bVar3 = (char)pcVar2 + 0x30;
        bVar7 = (char)pcVar2 + 0x2a;
        if ((char)bVar3 < '\x10') {
          bVar7 = bVar3;
        }
        bVar7 = -(pcVar2 == (char *)0x0) | bVar7;
        pcVar2 = strchr(_hexchar_to_value_HEX,(int)src[uVar5 + 1]);
        bVar4 = (char)pcVar2 + 0x30;
        bVar3 = (char)pcVar2 + 0x2a;
        if ((char)bVar4 < '\x10') {
          bVar3 = bVar4;
        }
        if (((char)bVar7 < '\0') || (bVar3 = -(pcVar2 == (char *)0x0) | bVar3, (char)bVar3 < '\0'))
        goto LAB_0014774c;
        uVar5 = uVar5 + 2;
        buffer[lVar6] = bVar3 | bVar7 << 4;
        lVar6 = lVar6 + 1;
      } while (uVar5 < sVar1);
    }
  }
  return lVar6;
}

Assistant:

ssize_t
strhex_to_bin(uint8_t *buffer, size_t buffer_len, const char *src) {
  size_t srclen, i, j;
  int8_t v1, v2;
  srclen = strlen(src);
  if ((srclen & 1) != 0 || buffer_len < srclen/2) {
    return -1;
  }

  for (i=0, j=0; i<srclen; j++) {
    v1 = _hexchar_to_value(src[i++]);
    v2 = _hexchar_to_value(src[i++]);

    if (v1 < 0 || v2 < 0) {
      return -1;
    }
    buffer[j] = (v1 << 4) | v2;
  }
  return j;
}